

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::getIterationName_abi_cxx11_
          (string *__return_storage_ptr__,InputVariablesCannotBeModifiedTest *this,
          _test_iteration iteration)

{
  TestError *this_00;
  _test_iteration iteration_local;
  InputVariablesCannotBeModifiedTest *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(iteration) {
  case TEST_ITERATION_FIRST:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Fragment shader input variable");
    break;
  case TEST_ITERATION_INPUT_FS_VARIABLE_IN_INPUT_BLOCK:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Fragment shader input variable wrapped in an input block");
    break;
  case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Fragment shader input variable passed to an inout function parameter");
    break;
  case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Fragment shader input variable passed to an out function parameter");
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Geometry shader input variable");
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE_IN_INPUT_BLOCK:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Geometry shader input variable wrapped in an input block");
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Geometry shader input variable passed to an inout function parameter");
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Geometry shader input variable passed to an out function parameter");
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized test iteration type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
               ,0x172);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case TEST_ITERATION_INPUT_TC_VARIABLE_IN_INPUT_BLOCK:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Tessellation control shader variable wrapped in an input block");
    break;
  case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Tessellation control shader variable passed to an inout function parameter");
    break;
  case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Tessellation control shader variable passed to an out function parameter");
    break;
  case TEST_ITERATION_INPUT_TE_PATCH_VARIABLE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Tessellation evaluation shader patch input variable");
    break;
  case TEST_ITERATION_INPUT_TE_VARIABLE:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Tessellation evaluation shader input variable");
    break;
  case TEST_ITERATION_INPUT_TE_VARIABLE_IN_INPUT_BLOCK:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Tessellation evaluation shader patch input variable wrapped in an input block");
    break;
  case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Tessellation evlauation shader patch input variable passed to an inout function parameter"
              );
    break;
  case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Tessellation evaluation shader patch input variable passed to an out function parameter"
              );
    break;
  case TEST_ITERATION_INPUT_VS_VARIABLE:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Vertex shader input variable")
    ;
    break;
  case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Vertex shader input variable passed to an inout function parameter");
    break;
  case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "Vertex shader input variable passed to an out function parameter");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputVariablesCannotBeModifiedTest::getIterationName(_test_iteration iteration) const
{
	std::string result;

	switch (iteration)
	{
	case TEST_ITERATION_INPUT_FS_VARIABLE:
		result = "Fragment shader input variable";
		break;
	case TEST_ITERATION_INPUT_FS_VARIABLE_IN_INPUT_BLOCK:
		result = "Fragment shader input variable wrapped in an input block";
		break;
	case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
		result = "Fragment shader input variable passed to an inout function parameter";
		break;
	case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
		result = "Fragment shader input variable passed to an out function parameter";
		break;
	case TEST_ITERATION_INPUT_GS_VARIABLE:
		result = "Geometry shader input variable";
		break;
	case TEST_ITERATION_INPUT_GS_VARIABLE_IN_INPUT_BLOCK:
		result = "Geometry shader input variable wrapped in an input block";
		break;
	case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
		result = "Geometry shader input variable passed to an inout function parameter";
		break;
	case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
		result = "Geometry shader input variable passed to an out function parameter";
		break;
	case TEST_ITERATION_INPUT_TC_VARIABLE_IN_INPUT_BLOCK:
		result = "Tessellation control shader variable wrapped in an input block";
		break;
	case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
		result = "Tessellation control shader variable passed to an inout function parameter";
		break;
	case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
		result = "Tessellation control shader variable passed to an out function parameter";
		break;
	case TEST_ITERATION_INPUT_TE_PATCH_VARIABLE:
		result = "Tessellation evaluation shader patch input variable";
		break;
	case TEST_ITERATION_INPUT_TE_VARIABLE:
		result = "Tessellation evaluation shader input variable";
		break;
	case TEST_ITERATION_INPUT_TE_VARIABLE_IN_INPUT_BLOCK:
		result = "Tessellation evaluation shader patch input variable wrapped in an input block";
		break;
	case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
		result = "Tessellation evlauation shader patch input variable passed to an inout function parameter";
		break;
	case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
		result = "Tessellation evaluation shader patch input variable passed to an out function parameter";
		break;
	case TEST_ITERATION_INPUT_VS_VARIABLE:
		result = "Vertex shader input variable";
		break;
	case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
		result = "Vertex shader input variable passed to an inout function parameter";
		break;
	case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
		result = "Vertex shader input variable passed to an out function parameter";
		break;

	default:
		TCU_FAIL("Unrecognized test iteration type.");
	} /* switch (iteration) */

	return result;
}